

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Gia_Man_t *
Gia_SweeperExtractUserLogic
          (Gia_Man_t *p,Vec_Int_t *vProbeIds,Vec_Ptr_t *vInNames,Vec_Ptr_t *vOutNames)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *p_01;
  char *pcVar4;
  Vec_Int_t *p_02;
  Gia_Man_t *pGVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  
  if ((vInNames != (Vec_Ptr_t *)0x0) && (p->vCis->nSize - p->nRegs != vInNames->nSize)) {
    __assert_fail("vInNames == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x16c,
                  "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  if ((vOutNames != (Vec_Ptr_t *)0x0) && (vProbeIds->nSize != vOutNames->nSize)) {
    __assert_fail("vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweeper.c"
                  ,0x16d,
                  "Gia_Man_t *Gia_SweeperExtractUserLogic(Gia_Man_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  Gia_ManIncrementTravId(p);
  p_00 = Vec_IntAlloc(1000);
  for (iVar7 = 0; iVar7 < vProbeIds->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vProbeIds,iVar7);
    iVar1 = Gia_SweeperProbeLit(p,iVar1);
    pGVar3 = Gia_Lit2Obj(p,iVar1);
    Gia_ManExtract_rec(p,(Gia_Obj_t *)((ulong)pGVar3 & 0xfffffffffffffffe),p_00);
  }
  p_01 = Gia_ManStart(((vProbeIds->nSize + p->vCis->nSize) - p->nRegs) + p_00->nSize + 0x65);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar4;
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCi(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_01);
    pGVar3->Value = uVar2;
  }
  Gia_ManHashStart(p_01);
  p_02 = Vec_IntAlloc(p_00->nSize);
  for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar7);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Vec_IntPush(p_02,pGVar3->Value);
    iVar1 = Gia_ObjFanin0Copy(pGVar3);
    iLit1 = Gia_ObjFanin1Copy(pGVar3);
    uVar2 = Gia_ManHashAnd(p_01,iVar1,iLit1);
    pGVar3->Value = uVar2;
  }
  Gia_ManHashStop(p_01);
  for (iVar7 = 0; iVar7 < vProbeIds->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(vProbeIds,iVar7);
    iVar1 = Gia_SweeperProbeLit(p,iVar1);
    pGVar3 = Gia_Lit2Obj(p,iVar1);
    Gia_ManAppendCo(p_01,(uint)pGVar3 & 1 ^ *(uint *)(((ulong)pGVar3 & 0xfffffffffffffffe) + 8));
  }
  for (iVar7 = 0; iVar7 < p->vCis->nSize - p->nRegs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCi(p,iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    pGVar3->Value = 0;
  }
  for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(p_00,iVar7);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar2 = Vec_IntEntry(p_02,iVar7);
    pGVar3->Value = uVar2;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_02);
  iVar7 = Gia_ManHasDangling(p_01);
  pGVar5 = p_01;
  if (iVar7 != 0) {
    pGVar5 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  if (vInNames != (Vec_Ptr_t *)0x0) {
    pVVar6 = Vec_PtrDupStr(vInNames);
    pGVar5->vNamesIn = pVVar6;
  }
  if (vOutNames != (Vec_Ptr_t *)0x0) {
    pVVar6 = Vec_PtrDupStr(vOutNames);
    pGVar5->vNamesOut = pVVar6;
  }
  return pGVar5;
}

Assistant:

Gia_Man_t * Gia_SweeperExtractUserLogic( Gia_Man_t * p, Vec_Int_t * vProbeIds, Vec_Ptr_t * vInNames, Vec_Ptr_t * vOutNames )
{
    Vec_Int_t * vObjIds, * vValues;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, ProbeId;
    assert( vInNames  == NULL || Gia_ManPiNum(p) == Vec_PtrSize(vInNames) );
    assert( vOutNames == NULL || Vec_IntSize(vProbeIds) == Vec_PtrSize(vOutNames) );
    // create new
    Gia_ManIncrementTravId( p );
    vObjIds = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManExtract_rec( p, Gia_Regular(pObj), vObjIds );
    }
    // create new manager
    pNew = Gia_ManStart( 1 + Gia_ManPiNum(p) + Vec_IntSize(vObjIds) + Vec_IntSize(vProbeIds) + 100 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    // create internal nodes
    Gia_ManHashStart( pNew );
    vValues = Vec_IntAlloc( Vec_IntSize(vObjIds) );
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
    {
        Vec_IntPush( vValues, pObj->Value );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    // create outputs
    Vec_IntForEachEntry( vProbeIds, ProbeId, i )
    {
        pObj = Gia_Lit2Obj( p, Gia_SweeperProbeLit(p, ProbeId) );
        Gia_ManAppendCo( pNew, Gia_Regular(pObj)->Value ^ Gia_IsComplement(pObj) );
    }
    // return the values back
    Gia_ManForEachPi( p, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( vObjIds, p, pObj, i )
        pObj->Value = Vec_IntEntry( vValues, i );
    Vec_IntFree( vObjIds );
    Vec_IntFree( vValues );
    // duplicate if needed
    if ( Gia_ManHasDangling(pNew) )
    {
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    // copy names if present
    if ( vInNames )
        pNew->vNamesIn = Vec_PtrDupStr( vInNames );
    if ( vOutNames )
        pNew->vNamesOut = Vec_PtrDupStr( vOutNames );
    return pNew;
}